

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O1

int sign_certificate(ptls_sign_certificate_t *_self,ptls_t *tls,uint16_t *selected_algorithm,
                    ptls_buffer_t *outbuf,ptls_iovec_t input,uint16_t *algorithms,
                    size_t num_algorithms)

{
  uint16_t *puVar1;
  EVP_PKEY *pkey;
  uint16_t uVar2;
  int iVar3;
  int iVar4;
  EVP_MD_CTX *ctx;
  EVP_MD *pEVar5;
  ptls_sign_certificate_t *ppVar6;
  ptls_sign_certificate_t *ppVar7;
  size_t sVar8;
  bool bVar9;
  size_t local_40;
  EVP_PKEY_CTX *local_38;
  
  uVar2 = *(uint16_t *)&_self[2].cb;
  if (uVar2 != 0xffff) {
    ppVar6 = _self;
    ppVar7 = _self + 2;
    do {
      if (num_algorithms != 0) {
        bVar9 = num_algorithms == 0;
        if (*algorithms != uVar2) {
          sVar8 = 1;
          do {
            bVar9 = num_algorithms == sVar8;
            if (bVar9) goto LAB_0010bc1b;
            puVar1 = algorithms + sVar8;
            sVar8 = sVar8 + 1;
          } while (*puVar1 != uVar2);
        }
        if (!bVar9) {
          *selected_algorithm = uVar2;
          pkey = (EVP_PKEY *)_self[1].cb;
          pEVar5 = (EVP_MD *)ppVar6[3].cb;
          ctx = (EVP_MD_CTX *)EVP_MD_CTX_new();
          if (ctx == (EVP_MD_CTX *)0x0) {
            iVar4 = 0x201;
          }
          else {
            iVar3 = EVP_DigestSignInit(ctx,&local_38,pEVar5,(ENGINE *)0x0,pkey);
            iVar4 = 0x203;
            if (iVar3 == 1) {
              iVar3 = EVP_PKEY_get_id(pkey);
              if (iVar3 == 6) {
                iVar3 = EVP_PKEY_CTX_set_rsa_padding(local_38,6);
                if ((iVar3 != 1) ||
                   (iVar3 = EVP_PKEY_CTX_set_rsa_pss_saltlen(local_38,0xffffffff), iVar3 != 1))
                goto LAB_0010bd42;
                pEVar5 = EVP_sha256();
                iVar3 = EVP_PKEY_CTX_set_rsa_mgf1_md(local_38,pEVar5);
                if (iVar3 != 1) goto LAB_0010bd42;
              }
              iVar3 = EVP_DigestSignUpdate(ctx,input.base,input.len);
              if ((iVar3 == 1) &&
                 (iVar3 = EVP_DigestSignFinal(ctx,(uchar *)0x0,&local_40), iVar3 == 1)) {
                msg("reserving %ld bytes",local_40);
                iVar4 = ptls_buffer_reserve(outbuf,local_40);
                if (iVar4 == 0) {
                  iVar3 = EVP_DigestSignFinal(ctx,outbuf->base + outbuf->off,&local_40);
                  iVar4 = 0x203;
                  if (iVar3 == 1) {
                    outbuf->off = outbuf->off + local_40;
                    iVar4 = 0;
                  }
                }
              }
            }
          }
LAB_0010bd42:
          if (ctx == (EVP_MD_CTX *)0x0) {
            return iVar4;
          }
          EVP_MD_CTX_free(ctx);
          return iVar4;
        }
      }
LAB_0010bc1b:
      uVar2 = *(uint16_t *)&ppVar7[2].cb;
      ppVar6 = ppVar7;
      ppVar7 = ppVar7 + 2;
    } while (uVar2 != 0xffff);
  }
  return 0x28;
}

Assistant:

static int sign_certificate(ptls_sign_certificate_t *_self, ptls_t *tls, uint16_t *selected_algorithm, ptls_buffer_t *outbuf,
                            ptls_iovec_t input, const uint16_t *algorithms, size_t num_algorithms)
{
    ptls_openssl_sign_certificate_t *self = (ptls_openssl_sign_certificate_t *)_self;
    const struct st_ptls_openssl_signature_scheme_t *scheme;

    /* select the algorithm */
    for (scheme = self->schemes; scheme->scheme_id != UINT16_MAX; ++scheme) {
        size_t i;
        for (i = 0; i != num_algorithms; ++i)
            if (algorithms[i] == scheme->scheme_id)
                goto Found;
    }
    return PTLS_ALERT_HANDSHAKE_FAILURE;

Found:
    *selected_algorithm = scheme->scheme_id;
    return do_sign(self->key, outbuf, input, scheme->scheme_md);
}